

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O0

int testDatumFloat(void)

{
  VRCORETYPE_ID VVar1;
  int iVar2;
  VRDatumConverter<MinVR::VRDatum> os;
  ostringstream buf;
  int j;
  float *pb;
  float b;
  VRDatumFloat a;
  int loopctr;
  int out;
  undefined4 in_stack_fffffffffffffd08;
  VRFloat in_stack_fffffffffffffd0c;
  int in_stack_fffffffffffffd10;
  VRInt in_stack_fffffffffffffd14;
  VRDatum_conflict *p;
  VRDatumFloat *this;
  string local_2a0 [32];
  string local_280 [32];
  ostringstream local_260 [376];
  VRDatum_conflict *local_e8;
  VRInt local_dc;
  string local_d8 [32];
  VRDatum_conflict *local_b8;
  VRFloat *local_b0;
  VRDatum_conflict *local_a8;
  VRFloat local_a0;
  undefined1 local_90 [32];
  VRDatumFloat local_70;
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
    this = &local_70;
    MinVR::VRDatumFloat::VRDatumFloat
              ((VRDatumFloat *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd0c);
    MinVR::VRDatum::getDescription_abi_cxx11_
              ((VRDatum *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    p = (VRDatum_conflict *)local_90;
    local_4 = std::__cxx11::string::compare((char *)p);
    std::__cxx11::string::~string((string *)p);
    os = MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::getValue
                   ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)
                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_a8 = os.datum;
    local_a0 = MinVR::VRDatumConverter::operator_cast_to_float
                         ((VRDatumConverter<MinVR::VRDatum> *)0x108bc1);
    local_4 = local_4 + (uint)(local_a0 != 37.123);
    local_b8 = (VRDatum_conflict *)
               MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::getValue
                         ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_b0 = MinVR::VRDatumConverter::operator_cast_to_float_
                         ((VRDatumConverter<MinVR::VRDatum> *)0x108c30);
    local_4 = local_4 + (uint)(*local_b0 != 37.123);
    VVar1 = MinVR::VRDatum::getType((VRDatum *)&local_70);
    local_4 = local_4 + (uint)(VVar1 != VRCORETYPE_FLOAT);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::compare((char *)local_d8);
    local_4 = local_4 + iVar2;
    std::__cxx11::string::~string(local_d8);
    local_e8 = (VRDatum_conflict *)
               MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::getValue
                         ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    in_stack_fffffffffffffd14 =
         MinVR::VRDatumConverter::operator_cast_to_int((VRDatumConverter<MinVR::VRDatum> *)0x108d1b)
    ;
    local_4 = local_4 + (uint)(in_stack_fffffffffffffd14 != 0x25);
    local_dc = in_stack_fffffffffffffd14;
    std::__cxx11::ostringstream::ostringstream(local_260);
    MinVR::operator<<((ostream *)os.datum,p);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_(this);
    std::__cxx11::ostringstream::str();
    in_stack_fffffffffffffd10 = std::__cxx11::string::compare(local_280);
    local_4 = in_stack_fffffffffffffd10 + local_4;
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::ostringstream::~ostringstream(local_260);
    MinVR::VRDatumFloat::~VRDatumFloat((VRDatumFloat *)0x108def);
  }
  return local_4;
}

Assistant:

int testDatumFloat() {

  int out = 0;

  LOOP {
    MinVR::VRDatumFloat a = MinVR::VRDatumFloat(37.123f);

    out = a.getDescription().compare("float");

    float b = a.getValue();

    out += (37.123f == b) ? 0 : 1;

    const float* pb = a.getValue();
    out += (37.123f == (*pb)) ? 0 : 1;
    
    out += (a.getType() == MinVR::VRCORETYPE_FLOAT) ? 0 : 1;

    out += a.getValueString().compare("37.123001");

    int j = a.getValue();
    out += (j == 37) ? 0 : 1;

    std::ostringstream buf;
    buf << a;
    out += a.getValueString().compare(buf.str());

    // std::cout << "a:" << a << ",a.getValueString()=" << a.getValueString() << ",buf=" << buf.str() << ",j:" << j << ",out=" << out << std::endl;

  }